

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

bool __thiscall
metaf::VisibilityGroup::appendFraction(VisibilityGroup *this,string *group,IncompleteText next)

{
  Modifier MVar1;
  uint uVar2;
  bool bVar3;
  Modifier MVar4;
  long lVar5;
  _Optional_payload_base<unsigned_int> _Var6;
  Unit UVar7;
  bool bVar8;
  optional<metaf::Distance> v;
  _Storage<metaf::Distance,_true> local_34;
  char local_24;
  
  lVar5 = std::__cxx11::string::find((char)group,0x2f);
  if (lVar5 == -1) {
    return false;
  }
  Distance::fromMileString((optional<metaf::Distance> *)&local_34._M_value,group,true);
  if (local_24 == '\x01') {
    bVar8 = (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
    MVar1 = (this->vis).distModifier;
    if ((MVar1 - DISTANT < 2 | bVar8) == 1) {
      if (((MVar1 < DISTANT) && (local_34._M_value.distModifier == NONE)) &&
         ((this->vis).distUnit == STATUTE_MILES)) {
        _Var6._M_payload = (_Storage<unsigned_int,_true>)0x0;
        _Var6._M_engaged = false;
        _Var6._5_3_ = 0;
        UVar7 = METERS;
        bVar3 = false;
        MVar4 = NONE;
        if (local_34._M_value.distUnit == STATUTE_MILES) {
          if (((bVar8 == false) ||
              (local_34._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged != true)) ||
             ((uVar2 = (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value,
              0x68db8 < (uVar2 * 0x3afb7e91 >> 4 | uVar2 * 0x10000000) ||
              (((uint)((int)local_34._M_value.dist.super__Optional_base<unsigned_int,_true,_true>.
                            _M_payload.super__Optional_payload_base<unsigned_int>._M_payload *
                      0x3afb7e91) >> 4 |
               (int)local_34._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload
                    .super__Optional_payload_base<unsigned_int>._M_payload * 0x10000000) < 0x68db9))
             )) goto LAB_001a87ae;
          _Var6 = (_Optional_payload_base<unsigned_int>)
                  ((ulong)((int)local_34._M_value.dist.
                                super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                super__Optional_payload_base<unsigned_int>._M_payload + uVar2) |
                  0x100000000);
          bVar3 = true;
          UVar7 = STATUTE_MILES;
          MVar4 = MVar1;
        }
      }
      else {
LAB_001a87ae:
        _Var6._M_payload = (_Storage<unsigned_int,_true>)0x0;
        _Var6._M_engaged = false;
        _Var6._5_3_ = 0;
        UVar7 = METERS;
        bVar3 = false;
        MVar4 = NONE;
      }
      if (!bVar3) goto LAB_001a87c8;
      (this->vis).distModifier = MVar4;
      (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = _Var6;
      (this->vis).distUnit = UVar7;
    }
    else {
      (this->vis).distModifier = local_34._0_4_;
      (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           (_Storage<unsigned_int,_true>)local_34._4_4_;
      *(ulong *)&(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_engaged =
           CONCAT44(local_34._M_value.distUnit,local_34._8_4_);
    }
    this->incompleteText = next;
    bVar8 = true;
  }
  else {
LAB_001a87c8:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool VisibilityGroup::appendFraction(const std::string & group, IncompleteText next) {
	if (group.find('/') == std::string::npos) return false;
	const auto v = Distance::fromMileString(group, true);
	if (!v.has_value()) return false;
	if (vis.isReported()) {
		const auto d = Distance::fromIntegerAndFraction(vis, std::move(*v));
		if (!d.has_value()) return false;
		vis = std::move(*d);
	} else {
		vis = std::move(*v);
	}
	incompleteText = next;
	return true;
}